

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables_map.h
# Opt level: O1

void __thiscall program_options::variable_value::~variable_value(variable_value *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_void__Op_any_ptr__Arg_ptr *p_Var1;
  
  this_00 = (this->m_value_semantic).
            super___shared_ptr<const_program_options::value_base,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  p_Var1 = (this->v)._M_manager;
  if (p_Var1 != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*p_Var1)(_Op_destroy,&this->v,(_Arg *)0x0);
    (this->v)._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  return;
}

Assistant:

variable_value(const std::any& xv, bool xdefaulted)
    : v(xv), m_defaulted(xdefaulted)
    {}